

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O3

json_token * __thiscall
mjs::anon_unknown_46::json_lexer::next_token(json_token *__return_storage_ptr__,json_lexer *this)

{
  pointer pwVar1;
  wchar_t wVar2;
  ulong uVar3;
  pointer pwVar4;
  json_token *pjVar5;
  long lVar6;
  bool bVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong extraout_RAX;
  wostream *pwVar13;
  native_error_exception *pnVar14;
  global_object *pgVar15;
  wstring_view *s_00;
  wstring_view *s_01;
  _Alloc_hider _Var16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  anon_class_16_2_032a7d33 invalid;
  size_t start;
  wstring s;
  wostringstream woss;
  wstring local_240;
  wstring *local_220;
  wstring_view local_218;
  long local_208 [2];
  wstring_view local_1f8;
  ulong local_1e8;
  wstring local_1e0;
  wstring_view local_1c0;
  json_token *local_1b0;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_190;
  ulong local_180;
  
  uVar3 = (this->text_)._M_string_length;
  uVar12 = this->pos_;
  if (uVar3 <= uVar12) {
    local_1a8._0_4_ = eof;
    local_198 = 0;
    local_190._M_local_buf[0] = L'\0';
    (this->tok_).type_ = eof;
    local_1a0._M_p = (pointer)&local_190;
    local_180 = uVar12;
    std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
    (this->tok_).pos_ = local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,
                      CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
    }
    goto LAB_00145e00;
  }
  pwVar4 = (this->text_)._M_dataplus._M_p;
  wVar2 = pwVar4[uVar12];
  uVar8 = (ushort)wVar2;
  uVar20 = uVar12 + 1;
  this->pos_ = uVar20;
  uVar19 = uVar20;
  local_1e8 = uVar12;
  if ((uVar8 < 0x21) && ((0x100002600U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
    if (uVar20 < uVar3) {
      do {
        uVar10 = (ulong)(ushort)pwVar4[uVar20];
        uVar19 = uVar20;
        if ((0x20 < uVar10) || ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0)) break;
        uVar20 = uVar20 + 1;
        uVar19 = uVar3;
      } while (uVar3 != uVar20);
    }
    local_1a8._0_4_ = whitespace;
    goto LAB_00145d63;
  }
  local_220 = &this->text_;
  uVar17 = wVar2 & 0xffff;
  uVar18 = wVar2 & 0xffff;
  if (uVar17 < 0x66) {
    if (uVar18 < 0x3a) {
      if (uVar18 == 0x2c) {
        local_1a8._0_4_ = comma;
        goto LAB_00145d63;
      }
      if (uVar18 == 0x2d) {
        bVar7 = false;
      }
      else {
LAB_0014605e:
        bVar7 = true;
        if (9 < (ushort)(uVar8 - 0x30)) {
LAB_001460c5:
          local_1b0 = __return_storage_ptr__;
          if (uVar18 != 0x22) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
            pwVar13 = std::operator<<((wostream *)local_1a8,"Unexpected token \"");
            std::__cxx11::wstring::substr((ulong)&local_240,(ulong)local_220);
            local_218._M_len = local_240._M_string_length;
            local_218._M_str = local_240._M_dataplus._M_p;
            cpp_quote_abi_cxx11_(&local_1e0,(mjs *)&local_218,s_01);
            pwVar13 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                (pwVar13,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
            pwVar13 = std::operator<<(pwVar13,"\" in JSON at position ");
            std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              CONCAT44(local_1e0.field_2._M_local_buf[1],
                                       local_1e0.field_2._M_local_buf[0]) * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,
                              local_240.field_2._M_allocated_capacity * 4 + 4);
            }
            pnVar14 = (native_error_exception *)__cxa_allocate_exception(0x58);
            pgVar15 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
            global_object::stack_trace_abi_cxx11_(&local_1e0,pgVar15);
            local_218._M_len = local_1e0._M_string_length;
            local_218._M_str = local_1e0._M_dataplus._M_p;
            std::__cxx11::wstringbuf::str();
            local_1f8._M_len = local_240._M_string_length;
            local_1f8._M_str = local_240._M_dataplus._M_p;
            native_error_exception::native_error_exception(pnVar14,syntax,&local_218,&local_1f8);
            __cxa_throw(pnVar14,&native_error_exception::typeinfo,
                        native_error_exception::~native_error_exception);
          }
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          local_1e0._M_string_length = 0;
          local_1e0.field_2._M_local_buf[0] = L'\0';
          if (uVar20 != uVar3) {
            bVar7 = false;
            do {
              uVar19 = uVar20 + 1;
              pwVar4 = (local_220->_M_dataplus)._M_p;
              uVar8 = (ushort)pwVar4[uVar20];
              uVar17 = (uint)uVar8;
              if (bVar7) {
                if (uVar19 == uVar3) {
                  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                  pwVar13 = std::operator<<((wostream *)local_1a8,
                                            "Unterminated escape sequence in JSON at position ");
                  std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
                  pnVar14 = (native_error_exception *)__cxa_allocate_exception(0x58);
                  pgVar15 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
                  global_object::stack_trace_abi_cxx11_(&local_240,pgVar15);
                  local_1f8._M_len = local_240._M_string_length;
                  local_1f8._M_str = local_240._M_dataplus._M_p;
                  std::__cxx11::wstringbuf::str();
                  local_1c0._M_len = (size_t)local_218._M_str;
                  local_1c0._M_str = (wchar_t *)local_218._M_len;
                  native_error_exception::native_error_exception
                            (pnVar14,syntax,&local_1f8,&local_1c0);
                  __cxa_throw(pnVar14,&native_error_exception::typeinfo,
                              native_error_exception::~native_error_exception);
                }
                if (uVar17 == 0x61 || uVar8 < 0x61) {
                  if (((uVar17 != 0x22) && (uVar17 != 0x2f)) && (uVar17 != 0x5c))
                  goto switchD_0014618a_caseD_6f;
                }
                else {
                  switch(uVar8) {
                  case 0x6e:
                    break;
                  case 0x6f:
                  case 0x70:
                  case 0x71:
                  case 0x73:
switchD_0014618a_caseD_6f:
                    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                    pwVar13 = std::operator<<((wostream *)local_1a8,"Invalid escape sequence \"\\");
                    local_240._M_dataplus._M_p._0_4_ = uVar17;
                    pwVar13 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                        (pwVar13,(wchar_t *)&local_240,1);
                    pwVar13 = std::operator<<(pwVar13,"\" in JSON at position ");
                    std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
                    pnVar14 = (native_error_exception *)__cxa_allocate_exception(0x58);
                    pgVar15 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this)
                    ;
                    global_object::stack_trace_abi_cxx11_(&local_240,pgVar15);
                    local_1f8._M_len = local_240._M_string_length;
                    local_1f8._M_str = local_240._M_dataplus._M_p;
                    std::__cxx11::wstringbuf::str();
                    local_1c0._M_len = (size_t)local_218._M_str;
                    local_1c0._M_str = (wchar_t *)local_218._M_len;
                    native_error_exception::native_error_exception
                              (pnVar14,syntax,&local_1f8,&local_1c0);
                    __cxa_throw(pnVar14,&native_error_exception::typeinfo,
                                native_error_exception::~native_error_exception);
                  case 0x72:
                    break;
                  case 0x74:
                    break;
                  case 0x75:
                    if (uVar3 < uVar20 + 6) {
                      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                      pwVar13 = std::operator<<((wostream *)local_1a8,
                                                "Unterminated escape sequence in JSON at position ")
                      ;
                      std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
                      pnVar14 = (native_error_exception *)__cxa_allocate_exception(0x58);
                      pgVar15 = (global_object *)
                                gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
                      global_object::stack_trace_abi_cxx11_(&local_240,pgVar15);
                      local_1f8._M_len = local_240._M_string_length;
                      local_1f8._M_str = local_240._M_dataplus._M_p;
                      std::__cxx11::wstringbuf::str();
                      local_1c0._M_len = (size_t)local_218._M_str;
                      local_1c0._M_str = (wchar_t *)local_218._M_len;
                      native_error_exception::native_error_exception
                                (pnVar14,syntax,&local_1f8,&local_1c0);
                      __cxa_throw(pnVar14,&native_error_exception::typeinfo,
                                  native_error_exception::~native_error_exception);
                    }
                    get_hex_value4(pwVar4 + uVar19);
                    std::__cxx11::wstring::push_back((wchar_t)&local_1e0);
                    uVar20 = uVar20 + 5;
                    bVar7 = false;
                    goto LAB_00146165;
                  default:
                    if ((uVar17 != 0x66) && (uVar17 != 0x62)) goto switchD_0014618a_caseD_6f;
                  }
                }
LAB_00146158:
                std::__cxx11::wstring::push_back((wchar_t)&local_1e0);
                bVar7 = false;
                uVar20 = uVar19;
              }
              else {
                bVar7 = true;
                uVar20 = uVar19;
                if (uVar17 != 0x5c) {
                  if (uVar17 != 0x22) {
                    if (uVar17 < 0x20) {
                      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                      pwVar13 = std::operator<<((wostream *)local_1a8,"Invalid character \"");
                      std::__cxx11::wstring::substr((ulong)&local_218,(ulong)local_220);
                      local_1f8._M_len = (size_t)local_218._M_str;
                      local_1f8._M_str = (wchar_t *)local_218._M_len;
                      cpp_quote_abi_cxx11_(&local_240,(mjs *)&local_1f8,s_00);
                      pwVar13 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                                          (pwVar13,local_240._M_dataplus._M_p,
                                           local_240._M_string_length);
                      pwVar13 = std::operator<<(pwVar13,"\" in JSON at position ");
                      std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
                      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                           *)local_240._M_dataplus._M_p != &local_240.field_2) {
                        operator_delete(local_240._M_dataplus._M_p,
                                        local_240.field_2._M_allocated_capacity * 4 + 4);
                      }
                      if ((long *)local_218._M_len != local_208) {
                        operator_delete((void *)local_218._M_len,local_208[0] * 4 + 4);
                      }
                      pnVar14 = (native_error_exception *)__cxa_allocate_exception(0x58);
                      pgVar15 = (global_object *)
                                gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
                      global_object::stack_trace_abi_cxx11_(&local_240,pgVar15);
                      local_1f8._M_len = local_240._M_string_length;
                      local_1f8._M_str = local_240._M_dataplus._M_p;
                      std::__cxx11::wstringbuf::str();
                      local_1c0._M_len = (size_t)local_218._M_str;
                      local_1c0._M_str = (wchar_t *)local_218._M_len;
                      native_error_exception::native_error_exception
                                (pnVar14,syntax,&local_1f8,&local_1c0);
                      __cxa_throw(pnVar14,&native_error_exception::typeinfo,
                                  native_error_exception::~native_error_exception);
                    }
                    goto LAB_00146158;
                  }
                  json_token::json_token((json_token *)local_1a8,string,&local_1e0,local_1e8);
                  (this->tok_).type_ = local_1a8._0_4_;
                  std::__cxx11::wstring::operator=
                            ((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
                  (this->tok_).pos_ = local_180;
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_1a0._M_p != &local_190) {
                    operator_delete(local_1a0._M_p,
                                    CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) *
                                    4 + 4);
                  }
                  __return_storage_ptr__ = local_1b0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) goto LAB_00145d99;
                  goto LAB_001463f6;
                }
              }
LAB_00146165:
            } while (uVar20 != uVar3);
          }
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
          pwVar13 = std::operator<<((wostream *)local_1a8,"Unterminated string in JSON at position "
                                   );
          std::wostream::_M_insert<unsigned_long>((ulong)pwVar13);
          pnVar14 = (native_error_exception *)__cxa_allocate_exception(0x58);
          pgVar15 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
          global_object::stack_trace_abi_cxx11_(&local_240,pgVar15);
          local_1f8._M_len = local_240._M_string_length;
          local_1f8._M_str = local_240._M_dataplus._M_p;
          std::__cxx11::wstringbuf::str();
          local_1c0._M_len = (size_t)local_218._M_str;
          local_1c0._M_str = (wchar_t *)local_218._M_len;
          native_error_exception::native_error_exception(pnVar14,syntax,&local_1f8,&local_1c0);
          __cxa_throw(pnVar14,&native_error_exception::typeinfo,
                      native_error_exception::~native_error_exception);
        }
      }
      local_240._M_dataplus._M_p = (pointer)&local_1e8;
      local_240._M_string_length = (size_type)this;
      if ((uVar20 < uVar3) &&
         (pwVar4 = (local_220->_M_dataplus)._M_p, (uint)(pwVar4[uVar12 + 1] + L'\xffffffd0') < 10))
      {
        do {
          uVar19 = uVar3;
          if ((2 - uVar3) + uVar20 == 1) goto LAB_00146362;
          lVar11 = uVar20 + 1;
          uVar20 = uVar20 + 1;
          uVar19 = uVar20;
        } while ((uint)(pwVar4[lVar11] + L'\xffffffd0') < 10);
LAB_0014628a:
        if ((uVar19 < uVar3) && (pwVar4 = (local_220->_M_dataplus)._M_p, pwVar4[uVar19] == L'.')) {
          uVar12 = uVar19 + 1;
          if ((uVar12 < uVar3) && (lVar11 = uVar19 + 1, (uint)(pwVar4[lVar11] + L'\xffffffd0') < 10)
             ) {
            do {
              uVar19 = uVar3;
              if ((2 - uVar3) + uVar12 == 1) goto LAB_00146362;
              lVar6 = uVar12 + 1;
              uVar12 = uVar12 + 1;
            } while ((uint)(pwVar4[lVar6] + L'\xffffffd0') < 10);
            uVar19 = uVar12;
            if ((uint)(pwVar4[lVar11] + L'\xffffffd0') < 10) goto LAB_001462eb;
          }
          goto LAB_00146350;
        }
LAB_001462eb:
        if ((uVar19 < uVar3) &&
           (pwVar4 = (local_220->_M_dataplus)._M_p, (pwVar4[uVar19] | 0x20U) == 0x65)) {
          uVar12 = uVar19 + 1;
          if (uVar12 != uVar3) {
            if ((pwVar4[uVar19 + 1] == L'-') || (pwVar4[uVar19 + 1] == L'+')) {
              uVar12 = uVar19 + 2;
            }
            if ((uVar12 < uVar3) && (pwVar1 = pwVar4 + uVar12, (uint)(*pwVar1 + L'\xffffffd0') < 10)
               ) {
              do {
                uVar19 = uVar3;
                if (uVar3 - 1 == uVar12) goto LAB_00146362;
                lVar11 = uVar12 + 1;
                uVar12 = uVar12 + 1;
              } while ((uint)(pwVar4[lVar11] + L'\xffffffd0') < 10);
              uVar19 = uVar12;
              if ((uint)(*pwVar1 + L'\xffffffd0') < 10) goto LAB_00146362;
            }
          }
          goto LAB_00146350;
        }
      }
      else {
        if (bVar7) goto LAB_0014628a;
LAB_00146350:
        next_token::anon_class_16_2_032a7d33::operator()((anon_class_16_2_032a7d33 *)&local_240);
        uVar19 = extraout_RAX;
      }
LAB_00146362:
      std::__cxx11::wstring::substr((ulong)&local_1e0,(ulong)local_220);
      json_token::json_token((json_token *)local_1a8,number,&local_1e0,local_1e8);
      (this->tok_).type_ = local_1a8._0_4_;
      std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
      (this->tok_).pos_ = local_180;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p,
                        CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) goto LAB_00145d99;
LAB_001463f6:
      lVar11 = CONCAT44(local_1e0.field_2._M_local_buf[1],local_1e0.field_2._M_local_buf[0]);
      _Var16._M_p = local_1e0._M_dataplus._M_p;
    }
    else {
      if (uVar18 == 0x3a) {
        local_1a8._0_4_ = colon;
      }
      else if (uVar18 == 0x5b) {
        local_1a8._0_4_ = lbracket;
      }
      else {
        if (uVar18 != 0x5d) goto LAB_0014605e;
        local_1a8._0_4_ = rbracket;
      }
LAB_00145d63:
      local_190._M_local_buf[0] = L'\0';
      local_198 = 0;
      (this->tok_).type_ = local_1a8._0_4_;
      local_1a0._M_p = (pointer)&local_190;
      local_180 = uVar12;
      std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
      (this->tok_).pos_ = local_180;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1a0._M_p == &local_190) goto LAB_00145d99;
      lVar11 = CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]);
      _Var16._M_p = local_1a0._M_p;
    }
    operator_delete(_Var16._M_p,lVar11 * 4 + 4);
  }
  else if (uVar17 < 0x74) {
    if (uVar17 != 0x66) {
      if (uVar17 != 0x6e) goto LAB_0014605e;
      iVar9 = std::__cxx11::wstring::compare((ulong)local_220,uVar20,(wchar_t *)0x3);
      if (iVar9 != 0) goto LAB_001460c5;
      local_1a8._0_4_ = null;
      goto LAB_00145fbf;
    }
    iVar9 = std::__cxx11::wstring::compare((ulong)local_220,uVar20,(wchar_t *)0x4);
    if (iVar9 != 0) goto LAB_001460c5;
    local_1a8._0_4_ = false_;
    local_198 = 0;
    local_190._M_local_buf[0] = L'\0';
    (this->tok_).type_ = false_;
    local_1a0._M_p = (pointer)&local_190;
    local_180 = uVar12;
    std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
    (this->tok_).pos_ = local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,
                      CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
    }
    uVar19 = uVar12 + 5;
  }
  else {
    if (uVar18 != 0x74) {
      if (uVar18 == 0x7b) {
        local_1a8._0_4_ = lbrace;
      }
      else {
        if (uVar18 != 0x7d) goto LAB_0014605e;
        local_1a8._0_4_ = rbrace;
      }
      goto LAB_00145d63;
    }
    iVar9 = std::__cxx11::wstring::compare((ulong)local_220,uVar20,(wchar_t *)0x3);
    if (iVar9 != 0) goto LAB_001460c5;
    local_1a8._0_4_ = true_;
LAB_00145fbf:
    local_198 = 0;
    local_190._M_local_buf[0] = L'\0';
    (this->tok_).type_ = local_1a8._0_4_;
    local_1a0._M_p = (pointer)&local_190;
    local_180 = uVar12;
    std::__cxx11::wstring::operator=((wstring *)&(this->tok_).text_,(wstring *)&local_1a0);
    (this->tok_).pos_ = local_180;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,
                      CONCAT44(local_190._M_local_buf[1],local_190._M_local_buf[0]) * 4 + 4);
    }
    uVar19 = uVar12 + 4;
  }
LAB_00145d99:
  this->pos_ = uVar19;
LAB_00145e00:
  __return_storage_ptr__->type_ = (this->tok_).type_;
  (__return_storage_ptr__->text_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->text_).field_2;
  pwVar4 = (this->tok_).text_._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&__return_storage_ptr__->text_,pwVar4,
             pwVar4 + (this->tok_).text_._M_string_length);
  pjVar5 = (json_token *)(this->tok_).pos_;
  __return_storage_ptr__->pos_ = (size_t)pjVar5;
  return pjVar5;
}

Assistant:

json_token next_token() {
        const auto len = text_.length();
        if (pos_ >= len) {
            tok_ = json_token{json_token_type::eof, pos_};
            return tok_;
        }

        const auto start = pos_;
        const char16_t ch = text_[pos_];
        auto end = ++pos_;

        if (json_is_whitespace(ch)) {
            while (end < len && json_is_whitespace(text_[end])) {
                ++end;
            }
            tok_ = json_token{json_token_type::whitespace, start};
        } else if (ch == '[') {
            tok_ = json_token{json_token_type::lbracket, start};
        } else if (ch == ']') {
            tok_ = json_token{json_token_type::rbracket, start};
        } else if (ch == '{') {
            tok_ = json_token{json_token_type::lbrace, start};
        } else if (ch == '}') {
            tok_ = json_token{json_token_type::rbrace, start};
        } else if (ch == ',') {
            tok_ = json_token{json_token_type::comma, start};
        } else if (ch == ':') {
            tok_ = json_token{json_token_type::colon, start};
        } else if (ch == 'n' && text_.compare(end, 3, L"ull") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::null, start};
        } else if (ch == 'f' && text_.compare(end, 4, L"alse") == 0) {
            end += 4;
            tok_ = json_token{json_token_type::false_, start};
        } else if (ch == 't' && text_.compare(end, 3, L"rue") == 0) {
            end += 3;
            tok_ = json_token{json_token_type::true_, start};
        } else if (ch == '-' || json_is_digit(ch)) {
            auto invalid = [&]() {
                std::wostringstream woss;
                woss << "Invalid number in JSON at position " << start;
                throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
            };
            auto decimal_digits = [&]() {
                bool any = false;
                while (end < len && isdigit(text_[end])) {
                    any = true;
                    ++end;
                }
                return any;
            };
            if (!decimal_digits() && ch == '-') {
                invalid();
            }
            if (end < len && text_[end] == '.') {
                ++end;
                if (!decimal_digits()) {
                    invalid();
                }
            }
            if (end < len && (text_[end] == 'e' || text_[end] == 'E')) {
                ++end;
                if (end == len) {
                    invalid();
                }
                if (text_[end] == '-' || text_[end] == '+') {
                    ++end;
                }
                if (!decimal_digits()) {
                    invalid();
                }
            }
            tok_ = json_token{json_token_type::number, text_.substr(start, end-start), start};
        } else if (ch == '"') {
            std::wstring s;
            for (bool escape = false;;) {
                if (end == len) {
                    std::wostringstream woss;
                    woss << "Unterminated string in JSON at position " << start;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                }
                const char16_t sch = text_[end++];
                if (escape) {
                    if (end == len) {
                        std::wostringstream woss;
                        woss << "Unterminated escape sequence in JSON at position " << end-1;
                        throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                    }
                    switch (sch) {
                    case '"': [[fallthrough]];
                    case '/': [[fallthrough]];
                    case '\\':
                        s.push_back(sch);
                        break;
                    case 'b': s.push_back(8); break;
                    case 'f': s.push_back(12); break;
                    case 'n': s.push_back(10); break;
                    case 'r': s.push_back(13); break;
                    case 't': s.push_back(9); break;
                    case 'u':
                        if (end + 5 > len) {
                            std::wostringstream woss;
                            woss << "Unterminated escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        try {
                            s.push_back(static_cast<char16_t>(get_hex_value4(&text_[end])));
                        } catch (const std::runtime_error&) {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                        end+=4;
                        break;
                    default:
                        {
                            std::wostringstream woss;
                            woss << "Invalid escape sequence \"\\" << (wchar_t)sch << "\" in JSON at position " << end-1;
                            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                        }
                    }
                    escape = false;
                } else if (sch == '"') {
                    break;
                } else if (sch == '\\') {
                    escape = true;
                } else if (sch < 0x20) {
                    std::wostringstream woss;
                    woss << "Invalid character \"" << cpp_quote(text_.substr(end - 1, 1)) << "\" in JSON at position " << end - 1;
                    throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
                } else {
                    s.push_back(sch);
                }
            }
            tok_ = json_token{json_token_type::string, std::move(s), start};
        } else {
            std::wostringstream woss;
            woss << "Unexpected token \"" << cpp_quote(text_.substr(start, 1)) << "\" in JSON at position " << start;
            throw native_error_exception{native_error_type::syntax, global_->stack_trace(), woss.str()};
        }

        pos_ = end;
        return tok_;
    }